

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelWalkerBase> *
Js::CreateAWalker<Js::RecyclableTypedArrayWalker>
          (ScriptContext *scriptContext,Var instance,Var originalInstance)

{
  ThreadContext *this;
  DebugManager *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  RecyclableTypedArrayWalker *this_01;
  HeapAllocator *alloc;
  ScriptContext *this_02;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  RecyclableTypedArrayWalker *local_38;
  IDiagObjectModelWalkerBase *pOMWalker;
  ReferencedArenaAdapter *pRefArena;
  Var originalInstance_local;
  Var instance_local;
  ScriptContext *scriptContext_local;
  
  pRefArena = (ReferencedArenaAdapter *)originalInstance;
  originalInstance_local = instance;
  instance_local = scriptContext;
  this = ScriptContext::GetThreadContext(scriptContext);
  this_00 = ThreadContext::GetDebugManager(this);
  pOMWalker = (IDiagObjectModelWalkerBase *)DebugManager::GetDiagnosticArena(this_00);
  if ((ReferencedArenaAdapter *)pOMWalker == (ReferencedArenaAdapter *)0x0) {
    scriptContext_local = (ScriptContext *)0x0;
  }
  else {
    pAVar1 = &Memory::ReferencedArenaAdapter::Arena((ReferencedArenaAdapter *)pOMWalker)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&RecyclableTypedArrayWalker::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0x32);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_60);
    local_70 = Memory::ArenaAllocator::Alloc;
    local_68 = 0;
    this_01 = (RecyclableTypedArrayWalker *)
              new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar1,0x3f67b0);
    RecyclableTypedArrayWalker::RecyclableTypedArrayWalker
              (this_01,(ScriptContext *)instance_local,originalInstance_local,pRefArena);
    local_38 = this_01;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,
               (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0x33);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_98);
    this_02 = (ScriptContext *)new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::WeakArenaReference
              ((WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)this_02,
               (ReferencedArenaAdapter *)pOMWalker,(IDiagObjectModelWalkerBase *)local_38);
    scriptContext_local = this_02;
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)scriptContext_local;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* CreateAWalker(ScriptContext * scriptContext, Var instance, Var originalInstance)
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), T, scriptContext, instance, originalInstance);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>,pRefArena, pOMWalker);
        }
        return nullptr;
    }